

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O3

void stable_grail_merge_without_buffer(int **arr,int len1,int len2)

{
  int **ppiVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  int **ppiVar12;
  
  uVar6 = (ulong)(uint)len2;
  if (len1 < len2) {
    if (len1 != 0) {
      while( true ) {
        lVar11 = (long)len1;
        iVar5 = (int)uVar6;
        iVar8 = iVar5;
        if (0 < iVar5) {
          uVar3 = 0xffffffff;
          uVar9 = uVar6;
          do {
            uVar7 = ((int)((int)uVar9 - uVar3) >> 1) + uVar3;
            if (**arr <= *arr[lVar11 + (int)uVar7]) {
              uVar9 = (ulong)uVar7;
              uVar7 = uVar3;
            }
            uVar3 = uVar7;
            iVar8 = (int)uVar9;
          } while ((int)uVar3 < iVar8 + -1);
        }
        if (iVar8 != 0) {
          stable_grail_rotate(arr,len1,iVar8);
          arr = arr + iVar8;
          uVar6 = (ulong)(uint)(iVar5 - iVar8);
        }
        if ((int)uVar6 == 0) break;
        lVar2 = 0;
        ppiVar12 = arr;
        do {
          if (lVar11 + -1 == lVar2) {
            return;
          }
          ppiVar1 = ppiVar12 + 1;
          ppiVar12 = ppiVar12 + 1;
          lVar2 = lVar2 + 1;
        } while (**ppiVar1 <= *arr[lVar11]);
        len1 = len1 - (int)lVar2;
        arr = ppiVar12;
      }
    }
  }
  else if (len2 != 0) {
    while( true ) {
      iVar8 = (int)uVar6;
      if (0 < len1) {
        iVar5 = -1;
        iVar10 = len1;
        do {
          iVar4 = (iVar10 - iVar5 >> 1) + iVar5;
          if (*arr[iVar4] <= *arr[(long)(iVar8 + len1) + -1]) {
            iVar5 = iVar4;
            iVar4 = iVar10;
          }
          iVar10 = iVar4;
        } while (iVar5 < iVar10 + -1);
        if (len1 - iVar10 != 0) {
          stable_grail_rotate(arr + iVar10,len1 - iVar10,iVar8);
          len1 = iVar10;
        }
      }
      if (len1 == 0) break;
      uVar6 = (ulong)iVar8;
      do {
        if (uVar6 == 1) {
          return;
        }
        lVar11 = uVar6 - 2;
        uVar6 = uVar6 - 1;
      } while (*arr[(long)len1 + -1] <= *arr[len1 + lVar11]);
    }
  }
  return;
}

Assistant:

static void GRAIL_MERGE_WITHOUT_BUFFER(SORT_TYPE *arr, int len1, int len2) {
  int h;

  if (len1 < len2) {
    while (len1) {
      h = GRAIL_BIN_SEARCH_LEFT(arr + len1, len2, arr);

      if (h != 0) {
        GRAIL_ROTATE(arr, len1, h);
        arr += h;
        len2 -= h;
      }

      if (len2 == 0) {
        break;
      }

      do {
        arr++;
        len1--;
      } while (len1 && SORT_CMP_A(arr, arr + len1) <= 0);
    }
  } else {
    while (len2) {
      h = GRAIL_BIN_SEARCH_RIGHT(arr, len1, arr + (len1 + len2 - 1));

      if (h != len1) {
        GRAIL_ROTATE(arr + h, len1 - h, len2);
        len1 = h;
      }

      if (len1 == 0) {
        break;
      }

      do {
        len2--;
      } while (len2 && SORT_CMP_A(arr + len1 - 1, arr + len1 + len2 - 1) <= 0);
    }
  }
}